

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigFlagsTable.cpp
# Opt level: O1

void * __thiscall Js::ConfigFlagsTable::GetProperty(ConfigFlagsTable *this,Flag flag)

{
  undefined2 in_register_00000032;
  
  switch(CONCAT22(in_register_00000032,flag)) {
  case 0:
    break;
  case 1:
    this = (ConfigFlagsTable *)&this->MemOpMissingValueValidate;
    break;
  case 2:
    this = (ConfigFlagsTable *)&this->OOPJITFixupValidate;
    break;
  case 3:
    this = (ConfigFlagsTable *)&this->ArenaNoFreeList;
    break;
  case 4:
    this = (ConfigFlagsTable *)&this->ArenaNoPageReuse;
    break;
  case 5:
    this = (ConfigFlagsTable *)&this->ArenaUseHeapAlloc;
    break;
  case 6:
    this = (ConfigFlagsTable *)&this->ValidateInlineStack;
    break;
  case 7:
    this = (ConfigFlagsTable *)&this->AsmDiff;
    break;
  case 8:
    this = (ConfigFlagsTable *)&this->AsmDumpMode;
    break;
  case 9:
    this = (ConfigFlagsTable *)&this->AsmJs;
    break;
  case 10:
    this = (ConfigFlagsTable *)&this->AsmJsStopOnError;
    break;
  case 0xb:
    this = (ConfigFlagsTable *)&this->AsmJsEdge;
    break;
  case 0xc:
    this = (ConfigFlagsTable *)&this->Wasm;
    break;
  case 0xd:
    this = (ConfigFlagsTable *)&this->WasmI64;
    break;
  case 0xe:
    this = (ConfigFlagsTable *)&this->WasmFastArray;
    break;
  case 0xf:
    this = (ConfigFlagsTable *)&this->WasmSharedArrayVirtualBuffer;
    break;
  case 0x10:
    this = (ConfigFlagsTable *)&this->WasmMathExFilter;
    break;
  case 0x11:
    this = (ConfigFlagsTable *)&this->WasmCheckVersion;
    break;
  case 0x12:
    this = (ConfigFlagsTable *)&this->WasmAssignModuleID;
    break;
  case 0x13:
    this = (ConfigFlagsTable *)&this->WasmIgnoreLimits;
    break;
  case 0x14:
    this = (ConfigFlagsTable *)&this->WasmFold;
    break;
  case 0x15:
    this = (ConfigFlagsTable *)&this->WasmIgnoreResponse;
    break;
  case 0x16:
    this = (ConfigFlagsTable *)&this->WasmMaxTableSize;
    break;
  case 0x17:
    this = (ConfigFlagsTable *)&this->WasmThreads;
    break;
  case 0x18:
    this = (ConfigFlagsTable *)&this->WasmMultiValue;
    break;
  case 0x19:
    this = (ConfigFlagsTable *)&this->WasmSignExtends;
    break;
  case 0x1a:
    this = (ConfigFlagsTable *)&this->WasmNontrapping;
    break;
  case 0x1b:
    this = (ConfigFlagsTable *)&this->WasmExperimental;
    break;
  case 0x1c:
    this = (ConfigFlagsTable *)&this->WasmSimd;
    break;
  case 0x1d:
    this = (ConfigFlagsTable *)&this->AssertBreak;
    break;
  case 0x1e:
    this = (ConfigFlagsTable *)&this->AssertPopUp;
    break;
  case 0x1f:
    this = (ConfigFlagsTable *)&this->AssertIgnore;
    break;
  case 0x20:
    this = (ConfigFlagsTable *)&this->AsyncDebugging;
    break;
  case 0x21:
    this = (ConfigFlagsTable *)&this->BailOnNoProfileLimit;
    break;
  case 0x22:
    this = (ConfigFlagsTable *)&this->BailOnNoProfileRejitLimit;
    break;
  case 0x23:
    this = (ConfigFlagsTable *)&this->BaselineMode;
    break;
  case 0x24:
    this = (ConfigFlagsTable *)&this->DumpOnCrash;
    break;
  case 0x25:
    this = (ConfigFlagsTable *)&this->FullMemoryDump;
    break;
  case 0x26:
    this = (ConfigFlagsTable *)&this->BailOut;
    break;
  case 0x27:
    this = (ConfigFlagsTable *)&this->BailOutAtEveryLine;
    break;
  case 0x28:
    this = (ConfigFlagsTable *)&this->BailOutAtEveryByteCode;
    break;
  case 0x29:
    this = (ConfigFlagsTable *)&this->BailOutAtEveryImplicitCall;
    break;
  case 0x2a:
    this = (ConfigFlagsTable *)&this->BailOutByteCode;
    break;
  case 0x2b:
    this = (ConfigFlagsTable *)&this->Benchmark;
    break;
  case 0x2c:
    this = (ConfigFlagsTable *)&this->BgJit;
    break;
  case 0x2d:
    this = (ConfigFlagsTable *)&this->BgParse;
    break;
  case 0x2e:
    this = (ConfigFlagsTable *)&this->BgJitDelay;
    break;
  case 0x2f:
    this = (ConfigFlagsTable *)&this->BgJitDelayFgBuffer;
    break;
  case 0x30:
    this = (ConfigFlagsTable *)&this->BgJitPendingFuncCap;
    break;
  case 0x31:
    this = (ConfigFlagsTable *)&this->CreateFunctionProxy;
    break;
  case 0x32:
    this = (ConfigFlagsTable *)&this->HybridFgJit;
    break;
  case 0x33:
    this = (ConfigFlagsTable *)&this->HybridFgJitBgQueueLengthThreshold;
    break;
  case 0x34:
    this = (ConfigFlagsTable *)&this->BytecodeHist;
    break;
  case 0x35:
    this = (ConfigFlagsTable *)&this->CurrentSourceInfo;
    break;
  case 0x36:
    this = (ConfigFlagsTable *)&this->CFGLog;
    break;
  case 0x37:
    this = (ConfigFlagsTable *)&this->CheckAlignment;
    break;
  case 0x38:
    this = (ConfigFlagsTable *)&this->CheckEmitBufferPermissions;
    break;
  case 0x39:
    this = (ConfigFlagsTable *)&this->CheckMemoryLeak;
    break;
  case 0x3a:
    this = (ConfigFlagsTable *)&this->DumpOnLeak;
    break;
  case 0x3b:
    this = (ConfigFlagsTable *)&this->CheckOpHelpers;
    break;
  case 0x3c:
    this = (ConfigFlagsTable *)&this->CloneInlinedPolymorphicCaches;
    break;
  case 0x3d:
    this = (ConfigFlagsTable *)&this->ConcurrentRuntime;
    break;
  case 0x3e:
    this = (ConfigFlagsTable *)&this->ConstructorInlineThreshold;
    break;
  case 0x3f:
    this = (ConfigFlagsTable *)&this->ConstructorCallsRequiredToFinalizeCachedType;
    break;
  case 0x40:
    this = (ConfigFlagsTable *)&this->PropertyCacheMissPenalty;
    break;
  case 0x41:
    this = (ConfigFlagsTable *)&this->PropertyCacheMissThreshold;
    break;
  case 0x42:
    this = (ConfigFlagsTable *)&this->PropertyCacheMissReset;
    break;
  case 0x43:
    this = (ConfigFlagsTable *)&this->CrashOnException;
    break;
  case 0x44:
    this = (ConfigFlagsTable *)&this->Debug;
    break;
  case 0x45:
    this = (ConfigFlagsTable *)&this->DebugBreak;
    break;
  case 0x46:
    this = (ConfigFlagsTable *)&this->StatementDebugBreak;
    break;
  case 0x47:
    this = (ConfigFlagsTable *)&this->DebugBreakOnPhaseBegin;
    break;
  case 0x48:
    this = (ConfigFlagsTable *)&this->DebugWindow;
    break;
  case 0x49:
    this = (ConfigFlagsTable *)&this->ParserStateCache;
    break;
  case 0x4a:
    this = (ConfigFlagsTable *)&this->CompressParserStateCache;
    break;
  case 0x4b:
    this = (ConfigFlagsTable *)&this->DeferTopLevelTillFirstCall;
    break;
  case 0x4c:
    this = (ConfigFlagsTable *)&this->DeferParse;
    break;
  case 0x4d:
    this = (ConfigFlagsTable *)&this->DirectCallTelemetryStats;
    break;
  case 0x4e:
    this = (ConfigFlagsTable *)&this->DisableArrayBTree;
    break;
  case 0x4f:
    this = (ConfigFlagsTable *)&this->DisableRentalThreading;
    break;
  case 0x50:
    this = (ConfigFlagsTable *)&this->DisableVTuneSourceLineInfo;
    break;
  case 0x51:
    this = (ConfigFlagsTable *)&this->DisplayMemStats;
    break;
  case 0x52:
    this = (ConfigFlagsTable *)&this->Dump;
    break;
  case 0x53:
    this = (ConfigFlagsTable *)&this->DumpIRAddresses;
    break;
  case 0x54:
    this = (ConfigFlagsTable *)&this->DumpLineNoInColor;
    break;
  case 0x55:
    this = (ConfigFlagsTable *)&this->DumpObjectGraphOnExit;
    break;
  case 0x56:
    this = (ConfigFlagsTable *)&this->DumpObjectGraphOnCollect;
    break;
  case 0x57:
    this = (ConfigFlagsTable *)&this->DumpEvalStringOnRemoval;
    break;
  case 0x58:
    this = (ConfigFlagsTable *)&this->DumpObjectGraphOnEnum;
    break;
  case 0x59:
    this = (ConfigFlagsTable *)&this->DynamicProfileCache;
    break;
  case 0x5a:
    this = (ConfigFlagsTable *)&this->Dpc;
    break;
  case 0x5b:
    this = (ConfigFlagsTable *)&this->DynamicProfileCacheDir;
    break;
  case 0x5c:
    this = (ConfigFlagsTable *)&this->DynamicProfileInput;
    break;
  case 0x5d:
    this = (ConfigFlagsTable *)&this->Dpi;
    break;
  case 0x5e:
    this = (ConfigFlagsTable *)&this->WininetProfileCache;
    break;
  case 0x5f:
    this = (ConfigFlagsTable *)&this->NoDynamicProfileInMemoryCache;
    break;
  case 0x60:
    this = (ConfigFlagsTable *)&this->ProfileBasedSpeculativeJit;
    break;
  case 0x61:
    this = (ConfigFlagsTable *)&this->ProfileBasedSpeculationCap;
    break;
  case 0x62:
    this = (ConfigFlagsTable *)&this->DynamicProfileMutatorDll;
    break;
  case 99:
    this = (ConfigFlagsTable *)&this->DynamicProfileMutator;
    break;
  case 100:
    this = (ConfigFlagsTable *)&this->ExecuteByteCodeBufferReturnsInvalidByteCode;
    break;
  case 0x65:
    this = (ConfigFlagsTable *)&this->ExpirableCollectionGCCount;
    break;
  case 0x66:
    this = (ConfigFlagsTable *)&this->ExpirableCollectionTriggerThreshold;
    break;
  case 0x67:
    this = (ConfigFlagsTable *)&this->SkipSplitOnNoResult;
    break;
  case 0x68:
    this = (ConfigFlagsTable *)&this->Force32BitByteCode;
    break;
  case 0x69:
    this = (ConfigFlagsTable *)&this->CollectGarbage;
    break;
  case 0x6a:
    this = (ConfigFlagsTable *)&this->Intl;
    break;
  case 0x6b:
    this = (ConfigFlagsTable *)&this->IntlBuiltIns;
    break;
  case 0x6c:
    this = (ConfigFlagsTable *)&this->IntlPlatform;
    break;
  case 0x6d:
    this = (ConfigFlagsTable *)&this->JsBuiltIn;
    break;
  case 0x6e:
    this = (ConfigFlagsTable *)&this->JitRepro;
    break;
  case 0x6f:
    this = (ConfigFlagsTable *)&this->EntryPointInfoRpcData;
    break;
  case 0x70:
    this = (ConfigFlagsTable *)&this->LdChakraLib;
    break;
  case 0x71:
    this = (ConfigFlagsTable *)&this->TestChakraLib;
    break;
  case 0x72:
    this = (ConfigFlagsTable *)&this->ES6;
    break;
  case 0x73:
    this = (ConfigFlagsTable *)&this->ES6All;
    break;
  case 0x74:
    this = (ConfigFlagsTable *)&this->ES6Experimental;
    break;
  case 0x75:
    this = (ConfigFlagsTable *)&this->ES7AsyncAwait;
    break;
  case 0x76:
    this = (ConfigFlagsTable *)&this->ES6DateParseFix;
    break;
  case 0x77:
    this = (ConfigFlagsTable *)&this->ES6FunctionNameFull;
    break;
  case 0x78:
    this = (ConfigFlagsTable *)&this->ES6Generators;
    break;
  case 0x79:
    this = (ConfigFlagsTable *)&this->ES7ExponentiationOperator;
    break;
  case 0x7a:
    this = (ConfigFlagsTable *)&this->ES7ValuesEntries;
    break;
  case 0x7b:
    this = (ConfigFlagsTable *)&this->ES7TrailingComma;
    break;
  case 0x7c:
    this = (ConfigFlagsTable *)&this->ES6IsConcatSpreadable;
    break;
  case 0x7d:
    this = (ConfigFlagsTable *)&this->ES6Math;
    break;
  case 0x7e:
    this = (ConfigFlagsTable *)&this->ESDynamicImport;
    break;
  case 0x7f:
    this = (ConfigFlagsTable *)&this->ES6Module;
    break;
  case 0x80:
    this = (ConfigFlagsTable *)&this->ES6Object;
    break;
  case 0x81:
    this = (ConfigFlagsTable *)&this->ES6Number;
    break;
  case 0x82:
    this = (ConfigFlagsTable *)&this->ES6ObjectLiterals;
    break;
  case 0x83:
    this = (ConfigFlagsTable *)&this->ES6Proxy;
    break;
  case 0x84:
    this = (ConfigFlagsTable *)&this->ES6Rest;
    break;
  case 0x85:
    this = (ConfigFlagsTable *)&this->ES6Spread;
    break;
  case 0x86:
    this = (ConfigFlagsTable *)&this->ES6String;
    break;
  case 0x87:
    this = (ConfigFlagsTable *)&this->ES6StringPrototypeFixes;
    break;
  case 0x88:
    this = (ConfigFlagsTable *)&this->ES2018ObjectRestSpread;
    break;
  case 0x89:
    this = (ConfigFlagsTable *)&this->ES6PrototypeChain;
    break;
  case 0x8a:
    this = (ConfigFlagsTable *)&this->ES6ToPrimitive;
    break;
  case 0x8b:
    this = (ConfigFlagsTable *)&this->ES6ToLength;
    break;
  case 0x8c:
    this = (ConfigFlagsTable *)&this->ES6ToStringTag;
    break;
  case 0x8d:
    this = (ConfigFlagsTable *)&this->ES6Unicode;
    break;
  case 0x8e:
    this = (ConfigFlagsTable *)&this->ES6UnicodeVerbose;
    break;
  case 0x8f:
    this = (ConfigFlagsTable *)&this->ES6Unscopables;
    break;
  case 0x90:
    this = (ConfigFlagsTable *)&this->ES6RegExSticky;
    break;
  case 0x91:
    this = (ConfigFlagsTable *)&this->ES2018RegExDotAll;
    break;
  case 0x92:
    this = (ConfigFlagsTable *)&this->ESExportNsAs;
    break;
  case 0x93:
    this = (ConfigFlagsTable *)&this->ES2018AsyncIteration;
    break;
  case 0x94:
    this = (ConfigFlagsTable *)&this->ESTopLevelAwait;
    break;
  case 0x95:
    this = (ConfigFlagsTable *)&this->ES6RegExPrototypeProperties;
    break;
  case 0x96:
    this = (ConfigFlagsTable *)&this->ES6RegExSymbols;
    break;
  case 0x97:
    this = (ConfigFlagsTable *)&this->ES6Verbose;
    break;
  case 0x98:
    this = (ConfigFlagsTable *)&this->ESObjectGetOwnPropertyDescriptors;
    break;
  case 0x99:
    this = (ConfigFlagsTable *)&this->ESSharedArrayBuffer;
    break;
  case 0x9a:
    this = (ConfigFlagsTable *)&this->ESBigInt;
    break;
  case 0x9b:
    this = (ConfigFlagsTable *)&this->ESNumericSeparator;
    break;
  case 0x9c:
    this = (ConfigFlagsTable *)&this->ESNullishCoalescingOperator;
    break;
  case 0x9d:
    this = (ConfigFlagsTable *)&this->ESHashbang;
    break;
  case 0x9e:
    this = (ConfigFlagsTable *)&this->ESSymbolDescription;
    break;
  case 0x9f:
    this = (ConfigFlagsTable *)&this->ESArrayFindFromLast;
    break;
  case 0xa0:
    this = (ConfigFlagsTable *)&this->ESPromiseAny;
    break;
  case 0xa1:
    this = (ConfigFlagsTable *)&this->ESImportMeta;
    break;
  case 0xa2:
    this = (ConfigFlagsTable *)&this->ESGlobalThis;
    break;
  case 0xa3:
    this = (ConfigFlagsTable *)&this->JitES6Generators;
    break;
  case 0xa4:
    this = (ConfigFlagsTable *)&this->FastLineColumnCalculation;
    break;
  case 0xa5:
    this = (ConfigFlagsTable *)&this->Filename;
    break;
  case 0xa6:
    this = (ConfigFlagsTable *)&this->FreeRejittedCode;
    break;
  case 0xa7:
    this = (ConfigFlagsTable *)&this->ForceGuardPages;
    break;
  case 0xa8:
    this = (ConfigFlagsTable *)&this->PrintGuardPageBounds;
    break;
  case 0xa9:
    this = (ConfigFlagsTable *)&this->ForceLegacyEngine;
    break;
  case 0xaa:
    this = (ConfigFlagsTable *)&this->Force;
    break;
  case 0xab:
    this = (ConfigFlagsTable *)&this->Stress;
    break;
  case 0xac:
    this = (ConfigFlagsTable *)&this->ForceArrayBTree;
    break;
  case 0xad:
    this = (ConfigFlagsTable *)&this->StrongArraySort;
    break;
  case 0xae:
    this = (ConfigFlagsTable *)&this->ForceCleanPropertyOnCollect;
    break;
  case 0xaf:
    this = (ConfigFlagsTable *)&this->ForceCleanCacheOnCollect;
    break;
  case 0xb0:
    this = (ConfigFlagsTable *)&this->ForceGCAfterJSONParse;
    break;
  case 0xb1:
    this = (ConfigFlagsTable *)&this->ForceDecommitOnCollect;
    break;
  case 0xb2:
    this = (ConfigFlagsTable *)&this->ForceDeferParse;
    break;
  case 0xb3:
    this = (ConfigFlagsTable *)&this->ForceDiagnosticsMode;
    break;
  case 0xb4:
    this = (ConfigFlagsTable *)&this->ForceGetWriteWatchOOM;
    break;
  case 0xb5:
    this = (ConfigFlagsTable *)&this->ForcePostLowerGlobOptInstrString;
    break;
  case 0xb6:
    this = (ConfigFlagsTable *)&this->ForceSplitScope;
    break;
  case 0xb7:
    this = (ConfigFlagsTable *)&this->EnumerateSpecialPropertiesInDebugger;
    break;
  case 0xb8:
    this = (ConfigFlagsTable *)&this->EnableContinueAfterExceptionWrappersForHelpers;
    break;
  case 0xb9:
    this = (ConfigFlagsTable *)&this->EnableContinueAfterExceptionWrappersForBuiltIns;
    break;
  case 0xba:
    this = (ConfigFlagsTable *)&this->EnableFunctionSourceReportForHeapEnum;
    break;
  case 0xbb:
    this = (ConfigFlagsTable *)&this->ForceFragmentAddressSpace;
    break;
  case 0xbc:
    this = (ConfigFlagsTable *)&this->ForceOOMOnEBCommit;
    break;
  case 0xbd:
    this = (ConfigFlagsTable *)&this->ForceDynamicProfile;
    break;
  case 0xbe:
    this = (ConfigFlagsTable *)&this->ForceES5Array;
    break;
  case 0xbf:
    this = (ConfigFlagsTable *)&this->ForceAsmJsLinkFail;
    break;
  case 0xc0:
    this = (ConfigFlagsTable *)&this->ForceExpireOnNonCacheCollect;
    break;
  case 0xc1:
    this = (ConfigFlagsTable *)&this->ForceFastPath;
    break;
  case 0xc2:
    this = (ConfigFlagsTable *)&this->ForceFloatPref;
    break;
  case 0xc3:
    this = (ConfigFlagsTable *)&this->ForceJITLoopBody;
    break;
  case 0xc4:
    this = (ConfigFlagsTable *)&this->ForceStaticInterpreterThunk;
    break;
  case 0xc5:
    this = (ConfigFlagsTable *)&this->DumpCommentsFromReferencedFiles;
    break;
  case 0xc6:
    this = (ConfigFlagsTable *)&this->DelayFullJITSmallFunc;
    break;
  case 199:
    this = (ConfigFlagsTable *)&this->EnableFatalErrorOnOOM;
    break;
  case 200:
    this = (ConfigFlagsTable *)&this->DeferLoadingAvailableSource;
    break;
  case 0xc9:
    this = (ConfigFlagsTable *)&this->ForceNative;
    break;
  case 0xca:
    this = (ConfigFlagsTable *)&this->ForceSerialized;
    break;
  case 0xcb:
    this = (ConfigFlagsTable *)&this->ForceSerializedBytecodeMajorVersion;
    break;
  case 0xcc:
    this = (ConfigFlagsTable *)&this->ForceSerializedBytecodeVersionSchema;
    break;
  case 0xcd:
    this = (ConfigFlagsTable *)&this->ForceStrictMode;
    break;
  case 0xce:
    this = (ConfigFlagsTable *)&this->ForceUndoDefer;
    break;
  case 0xcf:
    this = (ConfigFlagsTable *)&this->ForceBlockingConcurrentCollect;
    break;
  case 0xd0:
    this = (ConfigFlagsTable *)&this->FreTestDiagMode;
    break;
  case 0xd1:
    this = (ConfigFlagsTable *)&this->ByteCodeBranchLimit;
    break;
  case 0xd2:
    this = (ConfigFlagsTable *)&this->MediumByteCodeLayout;
    break;
  case 0xd3:
    this = (ConfigFlagsTable *)&this->LargeByteCodeLayout;
    break;
  case 0xd4:
    this = (ConfigFlagsTable *)&this->InduceCodeGenFailure;
    break;
  case 0xd5:
    this = (ConfigFlagsTable *)&this->InduceCodeGenFailureSeed;
    break;
  case 0xd6:
    this = (ConfigFlagsTable *)&this->InjectPartiallyInitializedInterpreterFrameError;
    break;
  case 0xd7:
    this = (ConfigFlagsTable *)&this->InjectPartiallyInitializedInterpreterFrameErrorType;
    break;
  case 0xd8:
    this = (ConfigFlagsTable *)&this->GenerateByteCodeBufferReturnsCantGenerate;
    break;
  case 0xd9:
    this = (ConfigFlagsTable *)&this->GoptCleanupThreshold;
    break;
  case 0xda:
    this = (ConfigFlagsTable *)&this->AsmGoptCleanupThreshold;
    break;
  case 0xdb:
    this = (ConfigFlagsTable *)&this->HighPrecisionDate;
    break;
  case 0xdc:
    this = (ConfigFlagsTable *)&this->InlineCountMax;
    break;
  case 0xdd:
    this = (ConfigFlagsTable *)&this->InlineCountMaxInLoopBodies;
    break;
  case 0xde:
    this = (ConfigFlagsTable *)&this->icminlb;
    break;
  case 0xdf:
    this = (ConfigFlagsTable *)&this->InlineInLoopBodyScaleDownFactor;
    break;
  case 0xe0:
    this = (ConfigFlagsTable *)&this->iilbsdf;
    break;
  case 0xe1:
    this = (ConfigFlagsTable *)&this->InlineThreshold;
    break;
  case 0xe2:
    this = (ConfigFlagsTable *)&this->AggressiveInlineCountMax;
    break;
  case 0xe3:
    this = (ConfigFlagsTable *)&this->AggressiveInlineThreshold;
    break;
  case 0xe4:
    this = (ConfigFlagsTable *)&this->InlineThresholdAdjustCountInLargeFunction;
    break;
  case 0xe5:
    this = (ConfigFlagsTable *)&this->InlineThresholdAdjustCountInMediumSizedFunction;
    break;
  case 0xe6:
    this = (ConfigFlagsTable *)&this->InlineThresholdAdjustCountInSmallFunction;
    break;
  case 0xe7:
    this = (ConfigFlagsTable *)&this->AsmJsInlineAdjust;
    break;
  case 0xe8:
    this = (ConfigFlagsTable *)&this->Interpret;
    break;
  case 0xe9:
    this = (ConfigFlagsTable *)&this->Instrument;
    break;
  case 0xea:
    this = (ConfigFlagsTable *)&this->JitQueueThreshold;
    break;
  case 0xeb:
    this = (ConfigFlagsTable *)&this->LeakReport;
    break;
  case 0xec:
    this = (ConfigFlagsTable *)&this->LoopInlineThreshold;
    break;
  case 0xed:
    this = (ConfigFlagsTable *)&this->LeafInlineThreshold;
    break;
  case 0xee:
    this = (ConfigFlagsTable *)&this->ConstantArgumentInlineThreshold;
    break;
  case 0xef:
    this = (ConfigFlagsTable *)&this->RecursiveInlineThreshold;
    break;
  case 0xf0:
    this = (ConfigFlagsTable *)&this->RecursiveInlineDepthMax;
    break;
  case 0xf1:
    this = (ConfigFlagsTable *)&this->RecursiveInlineDepthMin;
    break;
  case 0xf2:
    this = (ConfigFlagsTable *)&this->RedeferralCap;
    break;
  case 0xf3:
    this = (ConfigFlagsTable *)&this->Loop;
    break;
  case 0xf4:
    this = (ConfigFlagsTable *)&this->LoopInterpretCount;
    break;
  case 0xf5:
    this = (ConfigFlagsTable *)&this->lic;
    break;
  case 0xf6:
    this = (ConfigFlagsTable *)&this->LoopProfileIterations;
    break;
  case 0xf7:
    this = (ConfigFlagsTable *)&this->OutsideLoopInlineThreshold;
    break;
  case 0xf8:
    this = (ConfigFlagsTable *)&this->MaxFuncInlineDepth;
    break;
  case 0xf9:
    this = (ConfigFlagsTable *)&this->MaxNumberOfInlineesWithLoop;
    break;
  case 0xfa:
    this = (ConfigFlagsTable *)&this->Memspect;
    break;
  case 0xfb:
    this = (ConfigFlagsTable *)&this->PolymorphicInlineThreshold;
    break;
  case 0xfc:
    this = (ConfigFlagsTable *)&this->PrimeRecycler;
    break;
  case 0xfd:
    this = (ConfigFlagsTable *)&this->PrivateHeap;
    break;
  case 0xfe:
    this = (ConfigFlagsTable *)&this->TraceEngineRefcount;
    break;
  case 0xff:
    this = (ConfigFlagsTable *)&this->LeakStackTrace;
    break;
  case 0x100:
    this = (ConfigFlagsTable *)&this->ForceMemoryLeak;
    break;
  case 0x101:
    this = (ConfigFlagsTable *)&this->DumpAfterFinalGC;
    break;
  case 0x102:
    this = (ConfigFlagsTable *)&this->ForceOldDateAPI;
    break;
  case 0x103:
    this = (ConfigFlagsTable *)&this->JitLoopBodyHotLoopThreshold;
    break;
  case 0x104:
    this = (ConfigFlagsTable *)&this->LoopBodySizeThresholdToDisableOpts;
    break;
  case 0x105:
    this = (ConfigFlagsTable *)&this->MaxJitThreadCount;
    break;
  case 0x106:
    this = (ConfigFlagsTable *)&this->ForceMaxJitThreadCount;
    break;
  case 0x107:
    this = (ConfigFlagsTable *)&this->MitigateSpectre;
    break;
  case 0x108:
    this = (ConfigFlagsTable *)&this->AddMaskingBlocks;
    break;
  case 0x109:
    this = (ConfigFlagsTable *)&this->PoisonVarArrayLoad;
    break;
  case 0x10a:
    this = (ConfigFlagsTable *)&this->PoisonIntArrayLoad;
    break;
  case 0x10b:
    this = (ConfigFlagsTable *)&this->PoisonFloatArrayLoad;
    break;
  case 0x10c:
    this = (ConfigFlagsTable *)&this->PoisonTypedArrayLoad;
    break;
  case 0x10d:
    this = (ConfigFlagsTable *)&this->PoisonStringLoad;
    break;
  case 0x10e:
    this = (ConfigFlagsTable *)&this->PoisonObjectsForLoads;
    break;
  case 0x10f:
    this = (ConfigFlagsTable *)&this->PoisonVarArrayStore;
    break;
  case 0x110:
    this = (ConfigFlagsTable *)&this->PoisonIntArrayStore;
    break;
  case 0x111:
    this = (ConfigFlagsTable *)&this->PoisonFloatArrayStore;
    break;
  case 0x112:
    this = (ConfigFlagsTable *)&this->PoisonTypedArrayStore;
    break;
  case 0x113:
    this = (ConfigFlagsTable *)&this->PoisonStringStore;
    break;
  case 0x114:
    this = (ConfigFlagsTable *)&this->PoisonObjectsForStores;
    break;
  case 0x115:
    this = (ConfigFlagsTable *)&this->MinInterpretCount;
    break;
  case 0x116:
    this = (ConfigFlagsTable *)&this->MinSimpleJitRunCount;
    break;
  case 0x117:
    this = (ConfigFlagsTable *)&this->MaxInterpretCount;
    break;
  case 0x118:
    this = (ConfigFlagsTable *)&this->Mic;
    break;
  case 0x119:
    this = (ConfigFlagsTable *)&this->MaxSimpleJitRunCount;
    break;
  case 0x11a:
    this = (ConfigFlagsTable *)&this->Msjrc;
    break;
  case 0x11b:
    this = (ConfigFlagsTable *)&this->MinMemOpCount;
    break;
  case 0x11c:
    this = (ConfigFlagsTable *)&this->Mmoc;
    break;
  case 0x11d:
    this = (ConfigFlagsTable *)&this->MaxCopyOnAccessArrayLength;
    break;
  case 0x11e:
    this = (ConfigFlagsTable *)&this->MinCopyOnAccessArrayLength;
    break;
  case 0x11f:
    this = (ConfigFlagsTable *)&this->CopyOnAccessArraySegmentCacheSize;
    break;
  case 0x120:
    this = (ConfigFlagsTable *)&this->MinTemplatizedJitRunCount;
    break;
  case 0x121:
    this = (ConfigFlagsTable *)&this->MinAsmJsInterpreterRunCount;
    break;
  case 0x122:
    this = (ConfigFlagsTable *)&this->MinTemplatizedJitLoopRunCount;
    break;
  case 0x123:
    this = (ConfigFlagsTable *)&this->MaxTemplatizedJitRunCount;
    break;
  case 0x124:
    this = (ConfigFlagsTable *)&this->Mtjrc;
    break;
  case 0x125:
    this = (ConfigFlagsTable *)&this->MaxAsmJsInterpreterRunCount;
    break;
  case 0x126:
    this = (ConfigFlagsTable *)&this->Maic;
    break;
  case 0x127:
    this = (ConfigFlagsTable *)&this->AutoProfilingInterpreter0Limit;
    break;
  case 0x128:
    this = (ConfigFlagsTable *)&this->ProfilingInterpreter0Limit;
    break;
  case 0x129:
    this = (ConfigFlagsTable *)&this->AutoProfilingInterpreter1Limit;
    break;
  case 0x12a:
    this = (ConfigFlagsTable *)&this->SimpleJitLimit;
    break;
  case 299:
    this = (ConfigFlagsTable *)&this->ProfilingInterpreter1Limit;
    break;
  case 300:
    this = (ConfigFlagsTable *)&this->ExecutionModeLimits;
    break;
  case 0x12d:
    this = (ConfigFlagsTable *)&this->Eml;
    break;
  case 0x12e:
    this = (ConfigFlagsTable *)&this->EnforceExecutionModeLimits;
    break;
  case 0x12f:
    this = (ConfigFlagsTable *)&this->Eeml;
    break;
  case 0x130:
    this = (ConfigFlagsTable *)&this->SimpleJitAfter;
    break;
  case 0x131:
    this = (ConfigFlagsTable *)&this->Sja;
    break;
  case 0x132:
    this = (ConfigFlagsTable *)&this->FullJitAfter;
    break;
  case 0x133:
    this = (ConfigFlagsTable *)&this->Fja;
    break;
  case 0x134:
    this = (ConfigFlagsTable *)&this->NewSimpleJit;
    break;
  case 0x135:
    this = (ConfigFlagsTable *)&this->MaxLinearIntCaseCount;
    break;
  case 0x136:
    this = (ConfigFlagsTable *)&this->MaxSingleCharStrJumpTableSize;
    break;
  case 0x137:
    this = (ConfigFlagsTable *)&this->MaxSingleCharStrJumpTableRatio;
    break;
  case 0x138:
    this = (ConfigFlagsTable *)&this->MinSwitchJumpTableSize;
    break;
  case 0x139:
    this = (ConfigFlagsTable *)&this->MaxLinearStringCaseCount;
    break;
  case 0x13a:
    this = (ConfigFlagsTable *)&this->MinDeferredFuncTokenCount;
    break;
  case 0x13b:
    this = (ConfigFlagsTable *)&this->SkipFuncCountForBailOnNoProfile;
    break;
  case 0x13c:
    this = (ConfigFlagsTable *)&this->MaxJITFunctionBytecodeByteLength;
    break;
  case 0x13d:
    this = (ConfigFlagsTable *)&this->MaxJITFunctionBytecodeCount;
    break;
  case 0x13e:
    this = (ConfigFlagsTable *)&this->MaxLoopsPerFunction;
    break;
  case 0x13f:
    this = (ConfigFlagsTable *)&this->FuncObjectInlineCacheThreshold;
    break;
  case 0x140:
    this = (ConfigFlagsTable *)&this->NoDeferParse;
    break;
  case 0x141:
    this = (ConfigFlagsTable *)&this->NoLogo;
    break;
  case 0x142:
    this = (ConfigFlagsTable *)&this->OOPJITMissingOpts;
    break;
  case 0x143:
    this = (ConfigFlagsTable *)&this->CrashOnOOPJITFailure;
    break;
  case 0x144:
    this = (ConfigFlagsTable *)&this->OOPCFGRegistration;
    break;
  case 0x145:
    this = (ConfigFlagsTable *)&this->ForceJITCFGCheck;
    break;
  case 0x146:
    this = (ConfigFlagsTable *)&this->UseJITTrampoline;
    break;
  case 0x147:
    this = (ConfigFlagsTable *)&this->NoNative;
    break;
  case 0x148:
    this = (ConfigFlagsTable *)&this->NopFrequency;
    break;
  case 0x149:
    this = (ConfigFlagsTable *)&this->NoStrictMode;
    break;
  case 0x14a:
    this = (ConfigFlagsTable *)&this->NormalizeStats;
    break;
  case 0x14b:
    this = (ConfigFlagsTable *)&this->Off;
    break;
  case 0x14c:
    this = (ConfigFlagsTable *)&this->OffProfiledByteCode;
    break;
  case 0x14d:
    this = (ConfigFlagsTable *)&this->On;
    break;
  case 0x14e:
    this = (ConfigFlagsTable *)&this->OutputFile;
    break;
  case 0x14f:
    this = (ConfigFlagsTable *)&this->OutputFileOpenMode;
    break;
  case 0x150:
    this = (ConfigFlagsTable *)&this->InMemoryTrace;
    break;
  case 0x151:
    this = (ConfigFlagsTable *)&this->InMemoryTraceBufferSize;
    break;
  case 0x152:
    this = (ConfigFlagsTable *)&this->TraceWithStack;
    break;
  case 0x153:
    this = (ConfigFlagsTable *)&this->PrintRunTimeDataCollectionTrace;
    break;
  case 0x154:
    this = (ConfigFlagsTable *)&this->Prejit;
    break;
  case 0x155:
    this = (ConfigFlagsTable *)&this->PrintSrcInDump;
    break;
  case 0x156:
    this = (ConfigFlagsTable *)&this->ProfileDictionary;
    break;
  case 0x157:
    this = (ConfigFlagsTable *)&this->Profile;
    break;
  case 0x158:
    this = (ConfigFlagsTable *)&this->ProfileThreshold;
    break;
  case 0x159:
    this = (ConfigFlagsTable *)&this->ProfileObjectLiteral;
    break;
  case 0x15a:
    this = (ConfigFlagsTable *)&this->ProfileMemory;
    break;
  case 0x15b:
    this = (ConfigFlagsTable *)&this->ProfileStrings;
    break;
  case 0x15c:
    this = (ConfigFlagsTable *)&this->ProfileTypes;
    break;
  case 0x15d:
    this = (ConfigFlagsTable *)&this->ProfileEvalMap;
    break;
  case 0x15e:
    this = (ConfigFlagsTable *)&this->ProfileBailOutRecordMemory;
    break;
  case 0x15f:
    this = (ConfigFlagsTable *)&this->ValidateIntRanges;
    break;
  case 0x160:
    this = (ConfigFlagsTable *)&this->RejitMaxBailOutCount;
    break;
  case 0x161:
    this = (ConfigFlagsTable *)&this->CallsToBailoutsRatioForRejit;
    break;
  case 0x162:
    this = (ConfigFlagsTable *)&this->LoopIterationsToBailoutsRatioForRejit;
    break;
  case 0x163:
    this = (ConfigFlagsTable *)&this->MinBailOutsBeforeRejit;
    break;
  case 0x164:
    this = (ConfigFlagsTable *)&this->MinBailOutsBeforeRejitForLoops;
    break;
  case 0x165:
    this = (ConfigFlagsTable *)&this->LibraryStackFrame;
    break;
  case 0x166:
    this = (ConfigFlagsTable *)&this->LibraryStackFrameDebugger;
    break;
  case 0x167:
    this = (ConfigFlagsTable *)&this->RecyclerStress;
    break;
  case 0x168:
    this = (ConfigFlagsTable *)&this->RecyclerBackgroundStress;
    break;
  case 0x169:
    this = (ConfigFlagsTable *)&this->RecyclerConcurrentStress;
    break;
  case 0x16a:
    this = (ConfigFlagsTable *)&this->RecyclerConcurrentRepeatStress;
    break;
  case 0x16b:
    this = (ConfigFlagsTable *)&this->RecyclerPartialStress;
    break;
  case 0x16c:
    this = (ConfigFlagsTable *)&this->RecyclerTrackStress;
    break;
  case 0x16d:
    this = (ConfigFlagsTable *)&this->RecyclerInduceFalsePositives;
    break;
  case 0x16e:
    this = (ConfigFlagsTable *)&this->RecyclerForceMarkInterior;
    break;
  case 0x16f:
    this = (ConfigFlagsTable *)&this->RecyclerPriorityBoostTimeout;
    break;
  case 0x170:
    this = (ConfigFlagsTable *)&this->RecyclerThreadCollectTimeout;
    break;
  case 0x171:
    this = (ConfigFlagsTable *)&this->EnableConcurrentSweepAlloc;
    break;
  case 0x172:
    this = (ConfigFlagsTable *)&this->ecsa;
    break;
  case 0x173:
    this = (ConfigFlagsTable *)&this->PageHeap;
    break;
  case 0x174:
    this = (ConfigFlagsTable *)&this->PageHeapAllocStack;
    break;
  case 0x175:
    this = (ConfigFlagsTable *)&this->PageHeapFreeStack;
    break;
  case 0x176:
    this = (ConfigFlagsTable *)&this->PageHeapBucketNumber;
    break;
  case 0x177:
    this = (ConfigFlagsTable *)&this->PageHeapBlockType;
    break;
  case 0x178:
    this = (ConfigFlagsTable *)&this->PageHeapDecommitGuardPage;
    break;
  case 0x179:
    this = (ConfigFlagsTable *)&this->RecyclerNoPageReuse;
    break;
  case 0x17a:
    this = (ConfigFlagsTable *)&this->RecyclerVerify;
    break;
  case 0x17b:
    this = (ConfigFlagsTable *)&this->RecyclerVerifyPadSize;
    break;
  case 0x17c:
    this = (ConfigFlagsTable *)&this->RecyclerTest;
    break;
  case 0x17d:
    this = (ConfigFlagsTable *)&this->RecyclerProtectPagesOnRescan;
    break;
  case 0x17e:
    this = (ConfigFlagsTable *)&this->RecyclerVerifyMark;
    break;
  case 0x17f:
    this = (ConfigFlagsTable *)&this->LowMemoryCap;
    break;
  case 0x180:
    this = (ConfigFlagsTable *)&this->NewPagesCapDuringBGSweeping;
    break;
  case 0x181:
    this = (ConfigFlagsTable *)&this->AllocPolicyLimit;
    break;
  case 0x182:
    this = (ConfigFlagsTable *)&this->RuntimeDataOutputFile;
    break;
  case 0x183:
    this = (ConfigFlagsTable *)&this->SpeculationCap;
    break;
  case 0x184:
    this = (ConfigFlagsTable *)&this->Stats;
    break;
  case 0x185:
    this = (ConfigFlagsTable *)&this->SwallowExceptions;
    break;
  case 0x186:
    this = (ConfigFlagsTable *)&this->PrintSystemException;
    break;
  case 0x187:
    this = (ConfigFlagsTable *)&this->SwitchOptHolesThreshold;
    break;
  case 0x188:
    this = (ConfigFlagsTable *)&this->TempMin;
    break;
  case 0x189:
    this = (ConfigFlagsTable *)&this->TempMax;
    break;
  case 0x18a:
    this = (ConfigFlagsTable *)&this->Trace;
    break;
  case 0x18b:
    this = (ConfigFlagsTable *)&this->LoopAlignNopLimit;
    break;
  case 0x18c:
    this = (ConfigFlagsTable *)&this->TraceMemory;
    break;
  case 0x18d:
    this = (ConfigFlagsTable *)&this->TraceMetaDataParsing;
    break;
  case 0x18e:
    this = (ConfigFlagsTable *)&this->TraceWin8Allocations;
    break;
  case 399:
    this = (ConfigFlagsTable *)&this->TraceWin8DeallocationsImmediate;
    break;
  case 400:
    this = (ConfigFlagsTable *)&this->PrintWin8StatsDetailed;
    break;
  case 0x191:
    this = (ConfigFlagsTable *)&this->TraceProtectPages;
    break;
  case 0x192:
    this = (ConfigFlagsTable *)&this->TraceAsyncDebugCalls;
    break;
  case 0x193:
    this = (ConfigFlagsTable *)&this->TrackDispatch;
    break;
  case 0x194:
    this = (ConfigFlagsTable *)&this->Verbose;
    break;
  case 0x195:
    this = (ConfigFlagsTable *)&this->UseFullName;
    break;
  case 0x196:
    this = (ConfigFlagsTable *)&this->Utf8;
    break;
  case 0x197:
    this = (ConfigFlagsTable *)&this->Version;
    break;
  case 0x198:
    this = (ConfigFlagsTable *)&this->WERExceptionSupport;
    break;
  case 0x199:
    this = (ConfigFlagsTable *)&this->ExtendedErrorStackForTestHost;
    break;
  case 0x19a:
    this = (ConfigFlagsTable *)&this->errorStackTrace;
    break;
  case 0x19b:
    this = (ConfigFlagsTable *)&this->DoHeapEnumOnEngineShutdown;
    break;
  case 0x19c:
    this = (ConfigFlagsTable *)&this->RegexTracing;
    break;
  case 0x19d:
    this = (ConfigFlagsTable *)&this->RegexProfile;
    break;
  case 0x19e:
    this = (ConfigFlagsTable *)&this->RegexDebug;
    break;
  case 0x19f:
    this = (ConfigFlagsTable *)&this->RegexDebugAST;
    break;
  case 0x1a0:
    this = (ConfigFlagsTable *)&this->RegexDebugAnnotatedAST;
    break;
  case 0x1a1:
    this = (ConfigFlagsTable *)&this->RegexBytecodeDebug;
    break;
  case 0x1a2:
    this = (ConfigFlagsTable *)&this->RegexOptimize;
    break;
  case 0x1a3:
    this = (ConfigFlagsTable *)&this->DynamicRegexMruListSize;
    break;
  case 0x1a4:
    this = (ConfigFlagsTable *)&this->OptimizeForManyInstances;
    break;
  case 0x1a5:
    this = (ConfigFlagsTable *)&this->EnableArrayTypeMutation;
    break;
  case 0x1a6:
    this = (ConfigFlagsTable *)&this->ArrayMutationTestSeed;
    break;
  case 0x1a7:
    this = (ConfigFlagsTable *)&this->TestTrace;
    break;
  case 0x1a8:
    this = (ConfigFlagsTable *)&this->EnableEvalMapCleanup;
    break;
  case 0x1a9:
    this = (ConfigFlagsTable *)&this->TraceObjectAllocation;
    break;
  case 0x1aa:
    this = (ConfigFlagsTable *)&this->Sse;
    break;
  case 0x1ab:
    this = (ConfigFlagsTable *)&this->DeletedPropertyReuseThreshold;
    break;
  case 0x1ac:
    this = (ConfigFlagsTable *)&this->ForceStringKeyedSimpleDictionaryTypeHandler;
    break;
  case 0x1ad:
    this = (ConfigFlagsTable *)&this->BigDictionaryTypeHandlerThreshold;
    break;
  case 0x1ae:
    this = (ConfigFlagsTable *)&this->TypeSnapshotEnumeration;
    break;
  case 0x1af:
    this = (ConfigFlagsTable *)&this->IsolatePrototypes;
    break;
  case 0x1b0:
    this = (ConfigFlagsTable *)&this->ChangeTypeOnProto;
    break;
  case 0x1b1:
    this = (ConfigFlagsTable *)&this->ShareInlineCaches;
    break;
  case 0x1b2:
    this = (ConfigFlagsTable *)&this->DisableDebugObject;
    break;
  case 0x1b3:
    this = (ConfigFlagsTable *)&this->DumpHeap;
    break;
  case 0x1b4:
    this = (ConfigFlagsTable *)&this->autoProxy;
    break;
  case 0x1b5:
    this = (ConfigFlagsTable *)&this->PerfHintLevel;
    break;
  case 0x1b6:
    this = (ConfigFlagsTable *)&this->MemProtectHeapStress;
    break;
  case 0x1b7:
    this = (ConfigFlagsTable *)&this->MemProtectHeapBackgroundStress;
    break;
  case 0x1b8:
    this = (ConfigFlagsTable *)&this->MemProtectHeapConcurrentStress;
    break;
  case 0x1b9:
    this = (ConfigFlagsTable *)&this->MemProtectHeapConcurrentRepeatStress;
    break;
  case 0x1ba:
    this = (ConfigFlagsTable *)&this->MemProtectHeapPartialStress;
    break;
  case 0x1bb:
    this = (ConfigFlagsTable *)&this->FixPropsOnPathTypes;
    break;
  case 0x1bc:
    this = (ConfigFlagsTable *)&this->BailoutTraceFilter;
    break;
  case 0x1bd:
    this = (ConfigFlagsTable *)&this->RejitTraceFilter;
    break;
  case 0x1be:
    this = (ConfigFlagsTable *)&this->MaxBackgroundFinishMarkCount;
    break;
  case 0x1bf:
    this = (ConfigFlagsTable *)&this->BackgroundFinishMarkWaitTime;
    break;
  case 0x1c0:
    this = (ConfigFlagsTable *)&this->MinBackgroundRepeatMarkRescanBytes;
    break;
  case 0x1c1:
    this = (ConfigFlagsTable *)&this->ZeroMemoryWithNonTemporalStore;
    break;
  case 0x1c2:
    this = (ConfigFlagsTable *)&this->MaxMarkStackPageCount;
    break;
  case 0x1c3:
    this = (ConfigFlagsTable *)&this->MaxTrackedObjectListCount;
    break;
  case 0x1c4:
    this = (ConfigFlagsTable *)&this->NumberAllocPlusSize;
    break;
  case 0x1c5:
    this = (ConfigFlagsTable *)&this->InitializeInterpreterSlotsWithInvalidStackVar;
    break;
  case 0x1c6:
    this = (ConfigFlagsTable *)&this->PRNGSeed0;
    break;
  case 0x1c7:
    this = (ConfigFlagsTable *)&this->PRNGSeed1;
    break;
  case 0x1c8:
    this = (ConfigFlagsTable *)&this->ClearInlineCachesOnCollect;
    break;
  case 0x1c9:
    this = (ConfigFlagsTable *)&this->InlineCacheInvalidationListCompactionThreshold;
    break;
  case 0x1ca:
    this = (ConfigFlagsTable *)&this->ConstructorCacheInvalidationThreshold;
    break;
  case 0x1cb:
    this = (ConfigFlagsTable *)&this->GCMemoryThreshold;
    break;
  case 0x1cc:
    this = (ConfigFlagsTable *)&this->SimulatePolyCacheWithOneTypeForInlineCacheIndex;
    break;
  case 0x1cd:
    this = (ConfigFlagsTable *)&this->JITServerIdleTimeout;
    break;
  case 0x1ce:
    this = (ConfigFlagsTable *)&this->JITServerMaxInactivePageAllocatorCount;
    break;
  case 0x1cf:
    this = (ConfigFlagsTable *)&this->StrictWriteBarrierCheck;
    break;
  case 0x1d0:
    this = (ConfigFlagsTable *)&this->WriteBarrierTest;
    break;
  case 0x1d1:
    this = (ConfigFlagsTable *)&this->ForceSoftwareWriteBarrier;
    break;
  case 0x1d2:
    this = (ConfigFlagsTable *)&this->VerifyBarrierBit;
    break;
  case 0x1d3:
    this = (ConfigFlagsTable *)&this->EnableBGFreeZero;
    break;
  case 0x1d4:
    this = (ConfigFlagsTable *)&this->KeepRecyclerTrackData;
    break;
  case 0x1d5:
    this = (ConfigFlagsTable *)&this->MaxSingleAllocSizeInMB;
    break;
  default:
    this = (ConfigFlagsTable *)0x0;
  }
  return this;
}

Assistant:

void *
    ConfigFlagsTable::GetProperty(Flag flag) const
    {
        switch(flag)
        {
        #define FLAG(type, name, ...) \
            \
            case name##Flag : \
                return reinterpret_cast<void*>(const_cast<type*>(&##name)); \

        #include "ConfigFlagsList.h"

            default:
                return NULL;
        }
    }